

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O0

void intgemm::kernel_write_test<(intgemm::CPUType)3,double>(void)

{
  StringRef capturedExpression;
  double *pdVar1;
  double *__last;
  double (*padVar2) [4];
  size_t __n;
  undefined1 auVar3 [16];
  AssertionHandler catchAssertionHandler;
  size_t i;
  AlignedVector<double> output;
  AlignedVector<double> input;
  ITransientExpression *expr;
  size_t in_stack_fffffffffffffe28;
  AssertionHandler *this;
  size_t in_stack_fffffffffffffe30;
  StringRef *macroName;
  AlignedVector<double> *in_stack_fffffffffffffe38;
  AssertionHandler *this_00;
  char *in_stack_fffffffffffffe40;
  ExprLhs<const_double_&> in_stack_fffffffffffffe48;
  SourceLineInfo *this_01;
  ITransientExpression *this_02;
  SourceLineInfo local_f0;
  StringRef local_e0;
  ulong local_88;
  ITransientExpression *local_80;
  AssertionHandler *pAStack_78;
  StringRef *pSStack_70;
  AssertionHandler *pAStack_68;
  AlignedVector<double> local_50;
  AlignedVector<double> local_40 [3];
  
  if (2 < kCPU) {
    AlignedVector<double>::AlignedVector
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    AlignedVector<double>::AlignedVector
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    pdVar1 = AlignedVector<double>::begin(local_40);
    __last = AlignedVector<double>::end(local_40);
    std::iota<double*,double>(pdVar1,__last,0.0);
    padVar2 = AlignedVector<double>::as<double__vector(4)>(local_40);
    expr = (ITransientExpression *)(*padVar2)[0];
    this = (AssertionHandler *)(*padVar2)[1];
    macroName = (StringRef *)(*padVar2)[2];
    this_00 = (AssertionHandler *)(*padVar2)[3];
    pdVar1 = AlignedVector<double>::begin(&local_50);
    this_02 = expr;
    local_80 = expr;
    pAStack_78 = this;
    pSStack_70 = macroName;
    pAStack_68 = this_00;
    kernels::write((int)pdVar1,(void *)0x0,__n);
    for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
      local_e0 = operator____catch_sr((char *)this,(size_t)expr);
      this_01 = &local_f0;
      Catch::SourceLineInfo::SourceLineInfo
                (this_01,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
                 ,0x1c);
      Catch::StringRef::StringRef((StringRef *)this_00,(char *)macroName);
      capturedExpression.m_size = (size_type)in_stack_fffffffffffffe48.m_lhs;
      capturedExpression.m_start = in_stack_fffffffffffffe40;
      Catch::AssertionHandler::AssertionHandler
                (this_00,macroName,(SourceLineInfo *)this,capturedExpression,
                 (Flags)((ulong)expr >> 0x20));
      AlignedVector<double>::operator[](&local_50,local_88);
      in_stack_fffffffffffffe48 =
           Catch::Decomposer::operator<=((Decomposer *)expr,(double *)0x28cd73);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_88;
      auVar3 = vpunpckldq_avx(auVar3,_DAT_00294030);
      auVar3 = vsubpd_avx(auVar3,_DAT_00294040);
      vpermilpd_avx(auVar3,1);
      Catch::ExprLhs<double_const&>::operator==
                ((ExprLhs<const_double_&> *)this_02,(double *)this_01);
      Catch::AssertionHandler::handleExpr(this,expr);
      Catch::BinaryExpr<const_double_&,_const_double_&>::~BinaryExpr
                ((BinaryExpr<const_double_&,_const_double_&> *)0x28ce02);
      Catch::AssertionHandler::complete(this);
      Catch::AssertionHandler::~AssertionHandler(this);
    }
    AlignedVector<double>::~AlignedVector((AlignedVector<double> *)0x28cf1d);
    AlignedVector<double>::~AlignedVector((AlignedVector<double> *)0x28cf2a);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}